

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *pTVar2;
  string source;
  string invalid_uniform_block_shader_source;
  string invalid_buffer_shader_source;
  string input_block_shader_source [3];
  string invalid_input_shader_source [5];
  string output_block_shader_source [6];
  string invalid_output_shader_source [6];
  
  invalid_buffer_shader_source._M_dataplus._M_p = (pointer)&invalid_buffer_shader_source.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&invalid_buffer_shader_source,
             "layout(std140) buffer MyBuffer\n{\n    float f;\n    int   i;\n    uint  ui;\n} myBuffers[2][2];\n\nvoid main()\n{\n"
             ,"");
  invalid_input_shader_source[0]._M_dataplus._M_p = (pointer)&invalid_input_shader_source[0].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)invalid_input_shader_source,"in  float input_variable","");
  invalid_input_shader_source[1]._M_dataplus._M_p = (pointer)&invalid_input_shader_source[1].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_input_shader_source + 1),"[2][2];\nout float output_variable","");
  invalid_input_shader_source[2]._M_dataplus._M_p = (pointer)&invalid_input_shader_source[2].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_input_shader_source + 2),";\n\nvoid main()\n{\n    output_variable",
             "");
  invalid_input_shader_source[3]._M_dataplus._M_p = (pointer)&invalid_input_shader_source[3].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_input_shader_source + 3)," = input_variable","");
  invalid_input_shader_source[4]._M_dataplus._M_p = (pointer)&invalid_input_shader_source[4].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_input_shader_source + 4),"[0][0];\n","");
  invalid_output_shader_source[0]._M_dataplus._M_p =
       (pointer)&invalid_output_shader_source[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)invalid_output_shader_source,"out float output_variable","");
  invalid_output_shader_source[1]._M_dataplus._M_p =
       (pointer)&invalid_output_shader_source[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_output_shader_source + 1),
             "[2][2];\n\nvoid main()\n{\n    output_variable","");
  invalid_output_shader_source[2]._M_dataplus._M_p =
       (pointer)&invalid_output_shader_source[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_output_shader_source + 2),"[0][0] = 0.0;\n    output_variable","");
  invalid_output_shader_source[3]._M_dataplus._M_p =
       (pointer)&invalid_output_shader_source[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_output_shader_source + 3),"[0][1] = 1.0;\n    output_variable","");
  invalid_output_shader_source[4]._M_dataplus._M_p =
       (pointer)&invalid_output_shader_source[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_output_shader_source + 4),"[1][0] = 2.0;\n    output_variable","");
  invalid_output_shader_source[5]._M_dataplus._M_p =
       (pointer)&invalid_output_shader_source[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_output_shader_source + 5),"[1][1] = 3.0;\n","");
  invalid_uniform_block_shader_source._M_dataplus._M_p =
       (pointer)&invalid_uniform_block_shader_source.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&invalid_uniform_block_shader_source,
             "layout(std140) uniform MyUniformBlock\n{\n    float f;\n    int   i;\n    uint  ui;\n} myUniformBlocks[2][2];\n\nvoid main()\n{\n"
             ,"");
  input_block_shader_source[0]._M_dataplus._M_p = (pointer)&input_block_shader_source[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)input_block_shader_source,
             "in  InBlock {\n    float input_variable;\n} in_block","");
  input_block_shader_source[1]._M_dataplus._M_p = (pointer)&input_block_shader_source[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(input_block_shader_source + 1),
             "[2][2];\nout float output_variable;\n\nvoid main()\n{\n    output_variable = in_block"
             ,"");
  input_block_shader_source[2]._M_dataplus._M_p = (pointer)&input_block_shader_source[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(input_block_shader_source + 2),"[0][0].input_variable;\n","");
  output_block_shader_source[0]._M_dataplus._M_p = (pointer)&output_block_shader_source[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)output_block_shader_source,
             "out OutBlock {\n    float output_variable;\n} out_block","");
  output_block_shader_source[1]._M_dataplus._M_p = (pointer)&output_block_shader_source[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(output_block_shader_source + 1),"[2][2];\n\nvoid main()\n{\n    out_block",
             "");
  output_block_shader_source[2]._M_dataplus._M_p = (pointer)&output_block_shader_source[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(output_block_shader_source + 2),
             "[0][0].output_variable = 0.0;\n    out_block","");
  output_block_shader_source[3]._M_dataplus._M_p = (pointer)&output_block_shader_source[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(output_block_shader_source + 3),
             "[0][1].output_variable = 1.0;\n    out_block","");
  output_block_shader_source[4]._M_dataplus._M_p = (pointer)&output_block_shader_source[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(output_block_shader_source + 4),
             "[1][0].output_variable = 2.0;\n    out_block","");
  output_block_shader_source[5]._M_dataplus._M_p = (pointer)&output_block_shader_source[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(output_block_shader_source + 5),"[1][1].output_variable = 3.0;\n","");
  source._M_dataplus._M_p = (pointer)&source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&source,invalid_buffer_shader_source._M_dataplus._M_p,
             invalid_buffer_shader_source._M_dataplus._M_p +
             invalid_buffer_shader_source._M_string_length);
  if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1e99);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((ulong)tested_shader_type) {
  default:
    goto switchD_00b7881e_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&source);
    goto switchD_00b7881e_caseD_0;
  case 3:
    puVar1 = &emit_quad_abi_cxx11_;
    break;
  case 4:
    puVar1 = &set_tesseation_abi_cxx11_;
  }
  std::__cxx11::string::_M_append((char *)&source,*puVar1);
switchD_00b7881e_caseD_0:
  std::__cxx11::string::_M_append((char *)&source,shader_end_abi_cxx11_);
  if (tested_shader_type < SHADER_TYPE_LAST) {
    (*(code *)(&DAT_01b181a8 + *(int *)(&DAT_01b181a8 + (ulong)tested_shader_type * 4)))();
    return;
  }
  pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar2,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1e9b);
  __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InteractionInterfaceArrays<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	/* Shader source with invalid buffer (buffer cannot be of arrays of arrays type). */
	const std::string invalid_buffer_shader_source = "layout(std140) buffer MyBuffer\n"
													 "{\n"
													 "    float f;\n"
													 "    int   i;\n"
													 "    uint  ui;\n"
													 "} myBuffers[2][2];\n\n"
													 "void main()\n"
													 "{\n";
	/* Shader source with invalid input (input cannot be of arrays of arrays type). */
	const std::string invalid_input_shader_source[] = { "in  float input_variable", "[2][2];\n"
																					"out float output_variable",
														";\n\n"
														"void main()\n"
														"{\n"
														"    output_variable",
														" = input_variable", "[0][0];\n" };
	/* Shader source with invalid output (output cannot be of arrays of arrays type). */
	const std::string invalid_output_shader_source[] = { "out float output_variable", "[2][2];\n\n"
																					  "void main()\n"
																					  "{\n"
																					  "    output_variable",
														 "[0][0] = 0.0;\n"
														 "    output_variable",
														 "[0][1] = 1.0;\n"
														 "    output_variable",
														 "[1][0] = 2.0;\n"
														 "    output_variable",
														 "[1][1] = 3.0;\n" };
	/* Shader source with invalid uniform block (uniform block cannot be of arrays of arrays type). */
	const std::string invalid_uniform_block_shader_source = "layout(std140) uniform MyUniformBlock\n"
															"{\n"
															"    float f;\n"
															"    int   i;\n"
															"    uint  ui;\n"
															"} myUniformBlocks[2][2];\n\n"
															"void main()\n"
															"{\n";
	/* Shader source with invalid input (input cannot be of arrays of arrays type). */
	const std::string input_block_shader_source[] = { "in  InBlock {\n"
													  "    float input_variable;\n"
													  "} in_block",

													  "[2][2];\n"
													  "out float output_variable;\n"
													  "\n"
													  "void main()\n"
													  "{\n"
													  "    output_variable = in_block",
													  "[0][0].input_variable;\n" };
	/* Shader source with invalid output (output cannot be of arrays of arrays type). */
	const std::string output_block_shader_source[] = { "out OutBlock {\n"
													   "    float output_variable;\n"
													   "} out_block",
													   "[2][2];\n"
													   "\n"
													   "void main()\n"
													   "{\n"
													   "    out_block",
													   "[0][0].output_variable = 0.0;\n"
													   "    out_block",
													   "[0][1].output_variable = 1.0;\n"
													   "    out_block",
													   "[1][0].output_variable = 2.0;\n"
													   "    out_block",
													   "[1][1].output_variable = 3.0;\n" };

	/* Verify that buffer arrays of arrays type is rejected. */
	{
		std::string source = invalid_buffer_shader_source;

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that INPUTs arrays of arrays type is rejected. */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		std::string source;

		source += invalid_input_shader_source[0];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[]";
		}

		source += invalid_input_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += invalid_input_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_input_shader_source[3];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[0]";
		}

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_input_shader_source[4];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that OUTPUTs arrays of arrays type is rejected. */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		std::string source;

		source += invalid_output_shader_source[0];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += invalid_output_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[3];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[4];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[5];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that uniform block arrays of arrays type is rejected. */
	{
		std::string source = invalid_uniform_block_shader_source;

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verifies if arrays of arrays of input blocks are accepted */
	if ((TestCaseBase<API>::VERTEX_SHADER_TYPE != tested_shader_type) &&
		(TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type))
	{
		std::string source;

		source += input_block_shader_source[0];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[]";
		}

		source += input_block_shader_source[1];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[0]";
		}

		source += input_block_shader_source[2];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS && API::ALLOW_IN_OUT_INTERFACE_BLOCKS,
							tested_shader_type, source);
	}

	/* Verifies if arrays of arrays of output blocks are accepted */
	if ((TestCaseBase<API>::FRAGMENT_SHADER_TYPE != tested_shader_type) &&
		(TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type))
	{
		std::string source;

		source = output_block_shader_source[0];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += output_block_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[3];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[4];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[5];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS && API::ALLOW_IN_OUT_INTERFACE_BLOCKS,
							tested_shader_type, source);
	}
}